

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

void copyTo<BupHeaderPS3>(BupHeader *out,BupHeaderPS3 *in)

{
  out->eh = *(uint16_t *)(in->eh).value_;
  out->ew = *(uint16_t *)(in->ew).value_;
  out->width = *(uint16_t *)(in->width).value_;
  out->height = *(uint16_t *)(in->height).value_;
  std::vector<BupChunk,_std::allocator<BupChunk>_>::resize
            (&out->chunks,(ulong)*(uint *)(in->baseChunks).value_);
  std::vector<BupExpressionChunk,_std::allocator<BupExpressionChunk>_>::resize
            (&out->expChunks,(ulong)*(uint *)(in->expChunks).value_);
  return;
}

Assistant:

void copyTo(BupHeader& out, const Header& in) {
	out.eh = in.eh.value();
	out.ew = in.ew.value();
	out.width = in.width.value();
	out.height = in.height.value();
	out.chunks.resize(in.baseChunks.value());
	out.expChunks.resize(in.expChunks.value());
}